

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O2

FillRule lunasvg::parseFillRule(string_view *input)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  long lVar1;
  bool bVar2;
  long lVar3;
  
  lVar1 = 0x10;
  do {
    lVar3 = lVar1;
    if (lVar3 == 0x40) {
      return NonZero;
    }
    __x._M_len = input->_M_len;
    __x._M_str = input->_M_str;
    bVar2 = std::operator==(__x,*(basic_string_view<char,_std::char_traits<char>_> *)
                                 (&UNK_001549e8 + lVar3));
    lVar1 = lVar3 + 0x18;
  } while (!bVar2);
  return (&UNK_001549e0)[lVar3];
}

Assistant:

static FillRule parseFillRule(const std::string_view& input)
{
    static const SVGEnumerationEntry<FillRule> entries[] = {
        {FillRule::NonZero, "nonzero"},
        {FillRule::EvenOdd, "evenodd"}
    };

    return parseEnumValue(input, entries, FillRule::NonZero);
}